

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::detail::Dispatch_Function::build_type_infos
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funcs)

{
  pointer psVar1;
  pointer pTVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *type_infos;
  pointer pTVar7;
  long lVar8;
  ulong uVar9;
  pointer psVar10;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> param_types;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_48;
  
  psVar10 = (t_funcs->
            super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (t_funcs->
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar10 == psVar1) {
    (__return_storage_ptr__->
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
              (__return_storage_ptr__,
               &((psVar10->
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->m_types);
    psVar10 = psVar10 + 1;
    if (psVar10 != psVar1) {
      bVar3 = false;
      do {
        std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
                  (&local_48,
                   &((psVar10->
                     super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->m_types);
        lVar5 = (long)local_48.
                      super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.
                      super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        pTVar7 = (__return_storage_ptr__->
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar2 = (__return_storage_ptr__->
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        lVar6 = (long)pTVar2 - (long)pTVar7;
        if (pTVar2 != pTVar7) {
          lVar8 = 0;
          uVar9 = 0;
          do {
            if ((ulong)(((long)local_48.
                               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_48.
                               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       ) <= uVar9) break;
            bVar4 = Type_Info::operator==
                              ((Type_Info *)((long)&pTVar7->m_type_info + lVar8),
                               (Type_Info *)
                               ((long)&(local_48.
                                        super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_type_info +
                               lVar8));
            if (!bVar4) {
              pTVar7 = (__return_storage_ptr__->
                       super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              *(pointer_____offset_0x10___ **)((long)&pTVar7->m_type_info + lVar8) =
                   &Boxed_Value::typeinfo;
              *(pointer_____offset_0x10___ **)((long)&pTVar7->m_bare_type_info + lVar8) =
                   &Boxed_Value::typeinfo;
              *(undefined4 *)((long)&pTVar7->m_flags + lVar8) = 0;
            }
            uVar9 = uVar9 + 1;
            pTVar7 = (__return_storage_ptr__->
                     super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar8 = lVar8 + 0x18;
          } while (uVar9 < (ulong)(((long)(__return_storage_ptr__->
                                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7
                                   >> 3) * -0x5555555555555555));
        }
        if (local_48.
            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        bVar3 = (bool)(bVar3 | lVar5 != lVar6);
        psVar10 = psVar10 + 1;
      } while (psVar10 != psVar1);
      if (bVar3) {
        std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::resize
                  (__return_storage_ptr__,1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Type_Info> build_type_infos(const std::vector<Proxy_Function> &t_funcs)
        {
          auto begin = t_funcs.cbegin();
          const auto &end = t_funcs.cend();

          if (begin != end)
          {
            std::vector<Type_Info> type_infos = (*begin)->get_param_types();

            ++begin;

            bool size_mismatch = false;

            while (begin != end)
            {
              std::vector<Type_Info> param_types = (*begin)->get_param_types();

              if (param_types.size() != type_infos.size())
              {
                size_mismatch = true;
              }

              for (size_t i = 0; i < type_infos.size() && i < param_types.size(); ++i)
              {
                if (!(type_infos[i] == param_types[i]))
                {
                  type_infos[i] = detail::Get_Type_Info<Boxed_Value>::get();
                }
              }

              ++begin;
            }

            assert(type_infos.size() > 0 && " type_info vector size is < 0, this is only possible if something else is broken");

            if (size_mismatch)
            {
              type_infos.resize(1);
            }

            return type_infos;
          }

          return std::vector<Type_Info>();
        }